

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_ts2ci.c
# Opt level: O2

uint32 * mk_ts2ci(model_def_t *mdef)

{
  uint uVar1;
  acmod_set_t *acmod_set;
  acmod_id_t aVar2;
  uint32 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  acmod_set = mdef->acmod_set;
  puVar3 = (uint32 *)
           __ckd_calloc__((ulong)mdef->n_tied_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                          ,0x3e);
  for (uVar4 = 0; uVar4 < mdef->n_tied_state; uVar4 = uVar4 + 1) {
    puVar3[uVar4] = 0xffffffff;
  }
  uVar4 = 0;
  do {
    if (mdef->n_defn <= uVar4) {
      for (uVar4 = 0; uVar4 < mdef->n_tied_state; uVar4 = uVar4 + 1) {
        if (puVar3[uVar4] == 0xffffffff) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                  ,0x50,"state %d has no mapping to a CI phone\n",uVar4 & 0xffffffff);
        }
      }
      return puVar3;
    }
    for (uVar6 = 0; uVar6 < mdef->defn[uVar4].n_state; uVar6 = uVar6 + 1) {
      uVar1 = mdef->defn[uVar4].state[uVar6];
      uVar5 = (ulong)uVar1;
      if ((uVar5 != 0xffffffff) && (puVar3[uVar5] == 0xffffffff)) {
        if (mdef->n_tied_state <= uVar1) {
          __assert_fail("ts < mdef->n_tied_state",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                        ,0x47,"uint32 *mk_ts2ci(model_def_t *)");
        }
        aVar2 = acmod_set_base_phone(acmod_set,(acmod_id_t)uVar4);
        puVar3[uVar5] = aVar2;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

uint32 *
mk_ts2ci(model_def_t *mdef)
{
    uint32 i, j;
    uint32 *map;
    uint32 ts;
    acmod_set_t *acmod_set = mdef->acmod_set;

    map = (uint32 *)ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (i = 0; i < mdef->n_tied_state; i++)
	map[i] = TYING_NO_ID;

    for (i = 0; i < mdef->n_defn; i++) {
	for (j = 0; j < mdef->defn[i].n_state; j++) {
	    ts = mdef->defn[i].state[j];
	    if ((ts != TYING_NON_EMITTING) && (map[ts] == TYING_NO_ID)) {
		assert(ts < mdef->n_tied_state);

		map[ts] = acmod_set_base_phone(acmod_set, i);
	    }
	}
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	if (map[i] == TYING_NO_ID) {
	    E_WARN("state %d has no mapping to a CI phone\n", i);
	}
    }

    return map;
}